

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumDotsTexture::Evaluate
          (SpectrumDotsTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  anon_class_24_3_48d30edf func;
  bool bVar1;
  TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
  *this_00;
  undefined1 auVar2 [64];
  SampledSpectrum SVar3;
  anon_class_16_2_278d1f37 func_00;
  Tuple2<pbrt::Point2,_float> local_b0;
  undefined1 local_a8 [16];
  Vector2f **ppVStack_98;
  float afStack_90 [4];
  Tuple2<pbrt::Vector2,_float> local_80;
  undefined8 local_78;
  Vector2f *local_70;
  TextureEvalContext local_68;
  undefined1 extraout_var [56];
  
  local_b0 = (Tuple2<pbrt::Point2,_float>)&local_78;
  local_a8._8_8_ = &local_b0;
  local_70 = (Vector2f *)&local_80;
  local_a8._0_8_ = &local_68;
  local_78 = 0;
  ppVStack_98 = &local_70;
  local_80.x = 0.0;
  local_80.y = 0.0;
  local_68.p.super_Tuple3<pbrt::Point3,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_68.p.super_Tuple3<pbrt::Point3,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_68.p.super_Tuple3<pbrt::Point3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_68.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_68.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_68.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_68.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_68.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_68.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_68.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  local_68.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  local_68.dudx = ctx.dudx;
  local_68.dudy = ctx.dudy;
  local_68.dvdx = ctx.dvdx;
  local_68.dvdy = ctx.dvdy;
  local_68.faceIndex = ctx.faceIndex;
  func.dstdx = (Vector2f **)local_a8._8_8_;
  func.ctx = (TextureEvalContext *)local_a8._0_8_;
  func.dstdy = ppVStack_98;
  auVar2._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar2._8_56_ = extraout_var;
  local_b0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar2._0_16_);
  bVar1 = DotsBase::Inside((Point2f *)&local_b0);
  if (bVar1) {
    this_00 = (TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
               *)&this->insideDot;
  }
  else {
    this_00 = (TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
               *)&this->outsideDot;
  }
  local_68.p.super_Tuple3<pbrt::Point3,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_68.p.super_Tuple3<pbrt::Point3,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_68.p.super_Tuple3<pbrt::Point3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_68.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_68.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_68.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_68.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_68.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_68.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_68.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  local_68.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  local_68.dudx = ctx.dudx;
  local_68.dudy = ctx.dudy;
  local_68.dvdx = ctx.dvdx;
  local_68.dvdy = ctx.dvdy;
  local_68.faceIndex = ctx.faceIndex;
  local_a8._0_4_ = lambda.lambda.values[0];
  local_a8._4_4_ = lambda.lambda.values[1];
  local_a8._8_4_ = lambda.lambda.values[2];
  local_a8._12_4_ = lambda.lambda.values[3];
  ppVStack_98 = (Vector2f **)lambda.pdf.values._0_8_;
  afStack_90[0] = lambda.pdf.values[2];
  afStack_90[1] = lambda.pdf.values[3];
  func_00.lambda = (SampledWavelengths *)local_a8;
  func_00.ctx = &local_68;
  SVar3 = TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
          ::
          Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                    (this_00,func_00);
  return (array<float,_4>)(array<float,_4>)SVar3;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Inside(st) ? insideDot.Evaluate(ctx, lambda)
                          : outsideDot.Evaluate(ctx, lambda);
    }